

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O2

void __thiscall GrpParser::glyphSpec(GrpParser *this)

{
  ASTFactory *pAVar1;
  RefAST RVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  NoViableAltException *pNVar6;
  RefAST *pRVar7;
  RefAST *this_00;
  RefAST tmp104_AST;
  RefAST tmp101_AST;
  ASTPair currentAST;
  RefAST glyphSpec_AST;
  RefCount<Token> local_b0;
  RefCount<Token> local_a8;
  RefCount<Token> local_a0;
  RefToken local_98;
  RefToken local_90;
  RefAST local_88;
  RefToken local_80;
  RefAST local_78;
  RefAST local_70;
  RefAST local_68;
  RefAST local_60;
  RefAST local_58;
  RefAST local_50;
  RefAST local_48;
  RefCount<Token> local_40;
  RefAST local_38;
  
  this_00 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_00,&nullAST);
  glyphSpec_AST = nullAST;
  currentAST.root.ref = (Ref *)0x0;
  currentAST.child.ref = (Ref *)0x0;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  RVar2 = nullAST;
  switch(iVar4) {
  case 0x1a:
    pseudoFunc(this);
    local_78.ref = (this->super_LLkParser).super_Parser.returnAST.ref;
    if (local_78.ref != (Ref *)0x0) {
      (local_78.ref)->count = (local_78.ref)->count + 1;
    }
    ASTFactory::addASTChild(&(this->super_LLkParser).super_Parser.astFactory,&currentAST,&local_78);
    pRVar7 = &local_78;
    break;
  case 0x1b:
    unicodeCodepoint(this);
    local_70.ref = (this->super_LLkParser).super_Parser.returnAST.ref;
    if (local_70.ref != (Ref *)0x0) {
      (local_70.ref)->count = (local_70.ref)->count + 1;
    }
    ASTFactory::addASTChild(&(this->super_LLkParser).super_Parser.astFactory,&currentAST,&local_70);
    pRVar7 = &local_70;
    break;
  case 0x1c:
    codepointFunc(this);
    local_50.ref = (this->super_LLkParser).super_Parser.returnAST.ref;
    if (local_50.ref != (Ref *)0x0) {
      (local_50.ref)->count = (local_50.ref)->count + 1;
    }
    ASTFactory::addASTChild(&(this->super_LLkParser).super_Parser.astFactory,&currentAST,&local_50);
    pRVar7 = &local_50;
    break;
  case 0x1d:
    glyphidFunc(this);
    local_58.ref = (this->super_LLkParser).super_Parser.returnAST.ref;
    if (local_58.ref != (Ref *)0x0) {
      (local_58.ref)->count = (local_58.ref)->count + 1;
    }
    ASTFactory::addASTChild(&(this->super_LLkParser).super_Parser.astFactory,&currentAST,&local_58);
    pRVar7 = &local_58;
    break;
  case 0x1e:
    postscriptFunc(this);
    local_60.ref = (this->super_LLkParser).super_Parser.returnAST.ref;
    if (local_60.ref != (Ref *)0x0) {
      (local_60.ref)->count = (local_60.ref)->count + 1;
    }
    ASTFactory::addASTChild(&(this->super_LLkParser).super_Parser.astFactory,&currentAST,&local_60);
    pRVar7 = &local_60;
    break;
  case 0x1f:
    unicodeFunc(this);
    local_68.ref = (this->super_LLkParser).super_Parser.returnAST.ref;
    if (local_68.ref != (Ref *)0x0) {
      (local_68.ref)->count = (local_68.ref)->count + 1;
    }
    ASTFactory::addASTChild(&(this->super_LLkParser).super_Parser.astFactory,&currentAST,&local_68);
    pRVar7 = &local_68;
    break;
  default:
    if (iVar4 == 6) {
      if (nullAST.ref != (Ref *)0x0) {
        (nullAST.ref)->count = (nullAST.ref)->count + 1;
      }
      tmp101_AST = RVar2;
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_a8,this,1);
      pAVar1 = &(this->super_LLkParser).super_Parser.astFactory;
      ASTFactory::create((ASTFactory *)&tmp104_AST,(RefToken *)pAVar1);
      RefCount<AST>::operator=(&tmp101_AST,&tmp104_AST);
      RefCount<AST>::~RefCount(&tmp104_AST);
      RefCount<Token>::~RefCount(&local_a8);
      Parser::match((Parser *)this,6);
      uVar5 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
      if (0x1f < uVar5) {
LAB_00171000:
        pNVar6 = (NoViableAltException *)__cxa_allocate_exception(0x40);
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_90,this,1);
        NoViableAltException::NoViableAltException(pNVar6,&local_90);
        __cxa_throw(pNVar6,&NoViableAltException::typeinfo,
                    NoViableAltException::~NoViableAltException);
      }
      if ((0xfc002040U >> (uVar5 & 0x1f) & 1) == 0) {
        if (uVar5 != 7) goto LAB_00171000;
      }
      else {
        glyphSpec(this);
        local_38.ref = this_00->ref;
        if (local_38.ref != (Ref *)0x0) {
          (local_38.ref)->count = (local_38.ref)->count + 1;
        }
        ASTFactory::addASTChild(pAVar1,&currentAST,&local_38);
        pRVar7 = &local_38;
        while( true ) {
          RefCount<AST>::~RefCount(pRVar7);
          iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
          bVar3 = BitSet::member(&_tokenSet_27,iVar4);
          if (!bVar3) break;
          uVar5 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
          RVar2 = nullAST;
          if (0x1f < uVar5) {
LAB_00170f71:
            pNVar6 = (NoViableAltException *)__cxa_allocate_exception(0x40);
            (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_80,this,1);
            NoViableAltException::NoViableAltException(pNVar6,&local_80);
            __cxa_throw(pNVar6,&NoViableAltException::typeinfo,
                        NoViableAltException::~NoViableAltException);
          }
          if ((0xfc002040U >> (uVar5 & 0x1f) & 1) == 0) {
            if (uVar5 != 0x15) goto LAB_00170f71;
            if (nullAST.ref != (Ref *)0x0) {
              (nullAST.ref)->count = (nullAST.ref)->count + 1;
            }
            tmp104_AST = RVar2;
            (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_40,this,1);
            ASTFactory::create((ASTFactory *)&stack0xffffffffffffff38,(RefToken *)pAVar1);
            RefCount<AST>::operator=(&tmp104_AST,(RefCount<AST> *)&stack0xffffffffffffff38);
            RefCount<AST>::~RefCount((RefCount<AST> *)&stack0xffffffffffffff38);
            RefCount<Token>::~RefCount(&local_40);
            Parser::match((Parser *)this,0x15);
            RefCount<AST>::~RefCount(&tmp104_AST);
          }
          glyphSpec(this);
          local_88.ref = this_00->ref;
          if (local_88.ref != (Ref *)0x0) {
            (local_88.ref)->count = (local_88.ref)->count + 1;
          }
          ASTFactory::addASTChild(pAVar1,&currentAST,&local_88);
          pRVar7 = &local_88;
        }
      }
      tmp104_AST.ref = nullAST.ref;
      if (nullAST.ref != (Ref *)0x0) {
        (nullAST.ref)->count = (nullAST.ref)->count + 1;
      }
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_b0,this,1);
      ASTFactory::create((ASTFactory *)&stack0xffffffffffffff38,(RefToken *)pAVar1);
      RefCount<AST>::operator=(&tmp104_AST,(RefCount<AST> *)&stack0xffffffffffffff38);
      RefCount<AST>::~RefCount((RefCount<AST> *)&stack0xffffffffffffff38);
      RefCount<Token>::~RefCount(&local_b0);
      Parser::match((Parser *)this,7);
      RefCount<AST>::~RefCount(&tmp104_AST);
    }
    else {
      if (iVar4 != 0xd) {
        pNVar6 = (NoViableAltException *)__cxa_allocate_exception(0x40);
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_98,this,1);
        NoViableAltException::NoViableAltException(pNVar6,&local_98);
        __cxa_throw(pNVar6,&NoViableAltException::typeinfo,
                    NoViableAltException::~NoViableAltException);
      }
      if (nullAST.ref != (Ref *)0x0) {
        (nullAST.ref)->count = (nullAST.ref)->count + 1;
      }
      tmp101_AST = RVar2;
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_a0,this,1);
      pAVar1 = &(this->super_LLkParser).super_Parser.astFactory;
      ASTFactory::create((ASTFactory *)&tmp104_AST,(RefToken *)pAVar1);
      RefCount<AST>::operator=(&tmp101_AST,&tmp104_AST);
      RefCount<AST>::~RefCount(&tmp104_AST);
      RefCount<Token>::~RefCount(&local_a0);
      if (tmp101_AST.ref != (Ref *)0x0) {
        (tmp101_AST.ref)->count = (tmp101_AST.ref)->count + 1;
      }
      local_48.ref = tmp101_AST.ref;
      ASTFactory::addASTChild(pAVar1,&currentAST,&local_48);
      RefCount<AST>::~RefCount(&local_48);
      Parser::match((Parser *)this,0xd);
    }
    pRVar7 = &tmp101_AST;
  }
  RefCount<AST>::~RefCount(pRVar7);
  RefCount<AST>::operator=(&glyphSpec_AST,&currentAST.root);
  RefCount<AST>::operator=(this_00,&glyphSpec_AST);
  RefCount<AST>::~RefCount(&glyphSpec_AST);
  ASTPair::~ASTPair(&currentAST);
  return;
}

Assistant:

void GrpParser::glyphSpec() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST glyphSpec_AST = nullAST;
	
	try {      // for error handling
		{
		switch ( LA(1)) {
		case IDENT:
		{
			RefAST tmp101_AST = nullAST;
			tmp101_AST = astFactory.create(LT(1));
			astFactory.addASTChild(currentAST, tmp101_AST);
			match(IDENT);
			break;
		}
		case LITERAL_codepoint:
		{
			codepointFunc();
			astFactory.addASTChild(currentAST, returnAST);
			break;
		}
		case LITERAL_glyphid:
		{
			glyphidFunc();
			astFactory.addASTChild(currentAST, returnAST);
			break;
		}
		case LITERAL_postscript:
		{
			postscriptFunc();
			astFactory.addASTChild(currentAST, returnAST);
			break;
		}
		case LITERAL_unicode:
		{
			unicodeFunc();
			astFactory.addASTChild(currentAST, returnAST);
			break;
		}
		case LIT_UHEX:
		{
			unicodeCodepoint();
			astFactory.addASTChild(currentAST, returnAST);
			break;
		}
		case LITERAL_pseudo:
		{
			pseudoFunc();
			astFactory.addASTChild(currentAST, returnAST);
			break;
		}
		case OP_LPAREN:
		{
			{
			RefAST tmp102_AST = nullAST;
			tmp102_AST = astFactory.create(LT(1));
			match(OP_LPAREN);
			{
			switch ( LA(1)) {
			case OP_LPAREN:
			case IDENT:
			case LITERAL_pseudo:
			case LIT_UHEX:
			case LITERAL_codepoint:
			case LITERAL_glyphid:
			case LITERAL_postscript:
			case LITERAL_unicode:
			{
				glyphSpec();
				astFactory.addASTChild(currentAST, returnAST);
				{
				do {
					if ((_tokenSet_27.member(LA(1)))) {
						{
						switch ( LA(1)) {
						case OP_COMMA:
						{
							RefAST tmp103_AST = nullAST;
							tmp103_AST = astFactory.create(LT(1));
							match(OP_COMMA);
							break;
						}
						case OP_LPAREN:
						case IDENT:
						case LITERAL_pseudo:
						case LIT_UHEX:
						case LITERAL_codepoint:
						case LITERAL_glyphid:
						case LITERAL_postscript:
						case LITERAL_unicode:
						{
							break;
						}
						default:
						{
							throw NoViableAltException(LT(1));
						}
						}
						}
						glyphSpec();
						astFactory.addASTChild(currentAST, returnAST);
					}
					else {
						goto _loop88;
					}
					
				} while (true);
				_loop88:;
				}
				break;
			}
			case OP_RPAREN:
			{
				break;
			}
			default:
			{
				throw NoViableAltException(LT(1));
			}
			}
			}
			RefAST tmp104_AST = nullAST;
			tmp104_AST = astFactory.create(LT(1));
			match(OP_RPAREN);
			}
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		glyphSpec_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_28);
	}
	returnAST = glyphSpec_AST;
}